

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::FeedbackPrimitiveTypeCase::
getGeometrySource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  ulong uVar8;
  string *psVar9;
  char *pcVar10;
  char *__s;
  char *pcVar11;
  ostringstream buf;
  ContextType local_1cc;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  iVar1 = *(int *)((long)this + 0x78);
  iVar2 = *(int *)((long)this + 0x7c);
  iVar3 = *(int *)((long)this + 0x80);
  pcVar11 = "basic-mode-drawElements-triangle_strip";
  if (iVar3 == 1) {
    pcVar11 = "basic-mode-drawElements-line_strip";
  }
  pcVar11 = pcVar11 + 0x18;
  uVar4 = iVar1 == 2 ^ 3;
  if (iVar2 != 0) {
    uVar4 = 1;
  }
  if (iVar3 == 0) {
    pcVar11 = "points";
  }
  iVar5 = (iVar3 == 1) + 3;
  if (iVar3 == 0) {
    iVar5 = 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout(",0x33);
  pcVar10 = "triangles";
  if (iVar1 == 2) {
    pcVar10 = "lines";
  }
  __s = "points";
  if (iVar2 == 0) {
    __s = pcVar10;
  }
  sVar6 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") in;\nlayout(",0xd);
  sVar6 = strlen(pcVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", max_vertices=",0xf);
  poVar7 = (ostream *)std::ostream::operator<<(local_1a8,iVar5 * uVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             ") out;\n\nin highp vec4 v_tessellationCoords[];\nout highp vec4 tf_someVertexPosition;\n\nvoid main (void)\n{\n\t// Emit primitive\n\tfor (int ndx = 0; ndx < gl_in.length(); ++ndx)\n\t{\n"
             ,0xae);
  uVar8 = (ulong)*(uint *)((long)this + 0x80);
  if (uVar8 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,&DAT_01c7d3c0 + *(int *)(&DAT_01c7d3c0 + uVar8 * 4),
               *(long *)(&DAT_01c7d3d0 + uVar8 * 8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t}\n}\n",5);
    std::__cxx11::stringbuf::str();
    local_1cc.super_ApiType.m_bits =
         (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
    anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x1af8059);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar9 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar9;
}

Assistant:

std::string FeedbackPrimitiveTypeCase::getGeometrySource (void) const
{
	const char* const	geometryInputPrimitive			= (m_tessellationPointMode) ? ("points") : (m_tessellationOutput == TESSELLATION_OUT_ISOLINES) ? ("lines") : ("triangles");
	const char* const	geometryOutputPrimitive			= (m_geometryOutputType == GEOMETRY_OUTPUT_POINTS) ? ("points") : (m_geometryOutputType == GEOMETRY_OUTPUT_LINES) ? ("line_strip") : ("triangle_strip");
	const int			numInputVertices				= (m_tessellationPointMode) ? (1) : (m_tessellationOutput == TESSELLATION_OUT_ISOLINES) ? (2) : (3);
	const int			numSingleVertexOutputVertices	= (m_geometryOutputType == GEOMETRY_OUTPUT_POINTS) ? (1) : (m_geometryOutputType == GEOMETRY_OUTPUT_LINES) ? (4) : (3);
	const int			numEmitVertices					= numInputVertices * numSingleVertexOutputVertices;
	std::ostringstream	buf;

	buf <<	"${VERSION_DECL}\n"
			"${EXTENSION_GEOMETRY_SHADER}"
			"layout(" << geometryInputPrimitive << ") in;\n"
			"layout(" << geometryOutputPrimitive << ", max_vertices=" << numEmitVertices <<") out;\n"
			"\n"
			"in highp vec4 v_tessellationCoords[];\n"
			"out highp vec4 tf_someVertexPosition;\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	// Emit primitive\n"
			"	for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n"
			"	{\n";

	switch (m_geometryOutputType)
	{
		case GEOMETRY_OUTPUT_POINTS:
			buf <<	"		// Draw point on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position;\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n";
			break;

		case GEOMETRY_OUTPUT_LINES:
			buf <<	"		// Draw cross on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(-0.02, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( 0.02,  0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( 0.02, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(-0.02,  0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n";
			break;

		case GEOMETRY_OUTPUT_TRIANGLES:
			buf <<	"		// Draw triangle on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(  0.00, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(  0.02,  0.00, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( -0.02,  0.00, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n";
			break;

		default:
			DE_ASSERT(false);
			return "";
	}

	buf <<	"	}\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}